

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9_hashmap_map(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  byte bVar1;
  undefined8 *puVar2;
  jx9_hashmap_node *pNode;
  jx9_vm *pjVar3;
  sxi32 sVar4;
  jx9_value *pSrc;
  anon_union_8_3_18420de5_for_x *pVal;
  jx9_hashmap_node **ppjVar5;
  uint uVar6;
  jx9_value *pValue;
  jx9_value sKey;
  jx9_value sResult;
  anon_union_8_3_18420de5_for_x *local_c0;
  anon_union_8_3_18420de5_for_x local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  anon_union_8_3_18420de5_for_x local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (((nArg < 2) || ((apArg[1]->iFlags & 0x40) == 0)) ||
     (pSrc = jx9_context_new_array(pCtx), pSrc == (jx9_value *)0x0)) {
    jx9MemObjRelease(pCtx->pRet);
  }
  else {
    puVar2 = (undefined8 *)(apArg[1]->x).pOther;
    local_68 = *puVar2;
    uStack_40 = 0;
    local_78.rVal = 0.0;
    local_58 = 0;
    uStack_50 = 0;
    uVar6 = 0;
    local_48 = 0;
    uStack_70 = 0x20;
    local_a8 = *puVar2;
    uStack_80 = 0;
    local_b8.rVal = 0.0;
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
    uStack_b0 = 0x20;
    uStack_a0 = local_a8;
    uStack_60 = local_68;
    if (*(int *)((long)puVar2 + 0x2c) != 0) {
      ppjVar5 = (jx9_hashmap_node **)(puVar2 + 2);
      do {
        pNode = *ppjVar5;
        pjVar3 = pNode->pMap->pVm;
        if (pNode->nValIdx < (pjVar3->aMemObj).nUsed) {
          pVal = (anon_union_8_3_18420de5_for_x *)
                 ((ulong)(pNode->nValIdx * (pjVar3->aMemObj).eSize) + (long)(pjVar3->aMemObj).pBase)
          ;
        }
        else {
          pVal = (anon_union_8_3_18420de5_for_x *)0x0;
        }
        local_c0 = pVal;
        if (pVal != (anon_union_8_3_18420de5_for_x *)0x0) {
          sVar4 = jx9VmCallUserFunction
                            ((jx9_vm *)*puVar2,*apArg,1,(jx9_value **)&local_c0,
                             (jx9_value *)&local_78);
          jx9HashmapExtractNodeKey(pNode,(jx9_value *)&local_b8);
          if (sVar4 == 0) {
            bVar1 = (byte)pSrc->iFlags;
            pVal = &local_78;
          }
          else {
            bVar1 = (byte)pSrc->iFlags;
          }
          if ((bVar1 & 0x40) != 0) {
            HashmapInsert((jx9_hashmap *)(pSrc->x).pOther,(jx9_value *)&local_b8,(jx9_value *)pVal);
          }
          jx9MemObjRelease((jx9_value *)&local_b8);
          jx9MemObjRelease((jx9_value *)&local_78);
        }
        ppjVar5 = &pNode->pPrev;
        uVar6 = uVar6 + 1;
      } while (uVar6 < *(uint *)((long)puVar2 + 0x2c));
    }
    jx9MemObjStore(pSrc,pCtx->pRet);
  }
  return 0;
}

Assistant:

static int jx9_hashmap_map(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pArray, *pValue, sKey, sResult;
	jx9_hashmap_node *pEntry;
	jx9_hashmap *pMap;
	sxu32 n;
	if( nArg < 2 || !jx9_value_is_json_array(apArg[1]) ){
		/* Invalid arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Point to the internal representation of the input hashmap */
	pMap = (jx9_hashmap *)apArg[1]->x.pOther;
	jx9MemObjInit(pMap->pVm, &sResult);
	jx9MemObjInit(pMap->pVm, &sKey);
	/* Perform the requested operation */
	pEntry = pMap->pFirst;
	for( n = 0 ; n < pMap->nEntry ; n++ ){
		/* Extrcat the node value */
		pValue = HashmapExtractNodeValue(pEntry);
		if( pValue ){
			sxi32 rc;
			/* Invoke the supplied callback */
			rc = jx9VmCallUserFunction(pMap->pVm, apArg[0], 1, &pValue, &sResult);
			/* Extract the node key */
			jx9HashmapExtractNodeKey(pEntry, &sKey);
			if( rc != SXRET_OK ){
				/* An error occured while invoking the supplied callback [i.e: not defined] */
				jx9_array_add_elem(pArray, &sKey, pValue); /* Keep the same value */
			}else{
				/* Insert the callback return value */
				jx9_array_add_elem(pArray, &sKey, &sResult);
			}
			jx9MemObjRelease(&sKey);
			jx9MemObjRelease(&sResult);
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
	}
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}